

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

void soul::ResolutionPass::FunctionResolver::findLeastMisspeltFunction
               (Scope *scope,string *name,string *nearest,size_t *lowestDistance)

{
  int iVar1;
  undefined4 extraout_var;
  pool_ref<soul::AST::Function> *ppVar2;
  Function *pFVar3;
  string *psVar4;
  pool_ref<soul::AST::ModuleBase> *ppVar5;
  ModuleBase *pMVar6;
  undefined1 auVar7 [16];
  pool_ref<soul::AST::ModuleBase> *sub;
  pool_ref<soul::AST::ModuleBase> *__end2_1;
  pool_ref<soul::AST::ModuleBase> *__begin2_1;
  pool_ref<soul::AST::ModuleBase> *local_138;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *local_130;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *__range2_1;
  string local_d0;
  string local_b0;
  pool_ref<soul::AST::Function> *local_80;
  size_t distance;
  string functionName;
  pool_ref<soul::AST::Function> *f;
  pool_ref<soul::AST::Function> *__end2;
  pool_ref<soul::AST::Function> *__begin2;
  ArrayView<soul::pool_ref<soul::AST::Function>_> *local_30;
  ArrayView<soul::pool_ref<soul::AST::Function>_> *__range2;
  size_t *lowestDistance_local;
  string *nearest_local;
  string *name_local;
  Scope *scope_local;
  
  __range2 = (ArrayView<soul::pool_ref<soul::AST::Function>_> *)lowestDistance;
  lowestDistance_local = (size_t *)nearest;
  nearest_local = name;
  name_local = (string *)scope;
  iVar1 = (*scope->_vptr_Scope[0xd])();
  __begin2 = (pool_ref<soul::AST::Function> *)CONCAT44(extraout_var,iVar1);
  local_30 = (ArrayView<soul::pool_ref<soul::AST::Function>_> *)&__begin2;
  __end2 = ArrayView<soul::pool_ref<soul::AST::Function>_>::begin(local_30);
  ppVar2 = ArrayView<soul::pool_ref<soul::AST::Function>_>::end(local_30);
  for (; __end2 != ppVar2; __end2 = __end2 + 1) {
    functionName.field_2._8_8_ = __end2;
    pFVar3 = pool_ref<soul::AST::Function>::operator->(__end2);
    psVar4 = Identifier::toString_abi_cxx11_(&pFVar3->name);
    std::__cxx11::string::string((string *)&distance,(string *)psVar4);
    local_80 = (pool_ref<soul::AST::Function> *)
               choc::text::getLevenshteinDistance<std::__cxx11::string>
                         (nearest_local,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &distance);
    if (local_80 < __range2->s) {
      __range2->s = local_80;
      (**(code **)(*(long *)name_local + 0x10))(&__range2_1);
      IdentifierPath::toString_abi_cxx11_(&local_d0,(IdentifierPath *)&__range2_1);
      TokenisedPathString::join(&local_b0,&local_d0,(string *)&distance);
      std::__cxx11::string::operator=((string *)lowestDistance_local,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      IdentifierPath::~IdentifierPath((IdentifierPath *)&__range2_1);
    }
    std::__cxx11::string::~string((string *)&distance);
  }
  auVar7 = (**(code **)(*(long *)name_local + 0x88))();
  local_138 = auVar7._8_8_;
  __begin2_1 = auVar7._0_8_;
  local_130 = (ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> *)&__begin2_1;
  __end2_1 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::begin(local_130);
  ppVar5 = ArrayView<soul::pool_ref<soul::AST::ModuleBase>_>::end(local_130);
  for (; __end2_1 != ppVar5; __end2_1 = __end2_1 + 1) {
    pMVar6 = pool_ref::operator_cast_to_ModuleBase_((pool_ref *)__end2_1);
    findLeastMisspeltFunction
              (&pMVar6->super_Scope,nearest_local,(string *)lowestDistance_local,(size_t *)__range2)
    ;
  }
  return;
}

Assistant:

static void findLeastMisspeltFunction (AST::Scope& scope, const std::string& name, std::string& nearest, size_t& lowestDistance)
        {
            for (auto& f : scope.getFunctions())
            {
                auto functionName = f->name.toString();
                auto distance = choc::text::getLevenshteinDistance (name, functionName);

                if (distance < lowestDistance)
                {
                    lowestDistance = distance;
                    nearest = TokenisedPathString::join (scope.getFullyQualifiedPath().toString(), functionName);
                }
            }

            for (auto& sub : scope.getSubModules())
                findLeastMisspeltFunction (sub, name, nearest, lowestDistance);
        }